

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<double,_4> * __thiscall
tcu::reflect<double,4>
          (Vector<double,_4> *__return_storage_ptr__,tcu *this,Vector<double,_4> *i,
          Vector<double,_4> *n)

{
  double dVar1;
  Vector<double,_4> local_40;
  Vector<double,_4> *local_20;
  Vector<double,_4> *n_local;
  Vector<double,_4> *i_local;
  
  local_20 = i;
  n_local = (Vector<double,_4> *)this;
  i_local = __return_storage_ptr__;
  dVar1 = dot<double,4>(i,(Vector<double,_4> *)this);
  operator*(&local_40,dVar1 * 2.0,local_20);
  operator-(__return_storage_ptr__,(Vector<double,_4> *)this,&local_40);
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> reflect (const Vector<T, Size>& i, const Vector<T, Size>& n)
{
	return i - T(2) * dot(n, i) * n;
}